

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# appender.cpp
# Opt level: O3

void __thiscall
duckdb::BaseAppender::AppendValueInternal<float,duckdb::uhugeint_t>
          (BaseAppender *this,Vector *col,float input)

{
  data_ptr_t pdVar1;
  idx_t iVar2;
  bool bVar3;
  InvalidInputException *this_00;
  duckdb *this_01;
  uhugeint_t result;
  uhugeint_t local_48;
  string local_38;
  
  this_01 = (duckdb *)0x0;
  bVar3 = TryCast::Operation<float,duckdb::uhugeint_t>(input,&local_48,false);
  if (bVar3) {
    pdVar1 = col->data;
    iVar2 = (this->chunk).count;
    *(uint64_t *)(pdVar1 + iVar2 * 0x10) = local_48.lower;
    *(uint64_t *)((long)(pdVar1 + iVar2 * 0x10) + 8) = local_48.upper;
    return;
  }
  this_00 = (InvalidInputException *)__cxa_allocate_exception(0x10);
  CastExceptionText<float,duckdb::uhugeint_t>(&local_38,this_01,input);
  InvalidInputException::InvalidInputException(this_00,(string *)&local_38);
  __cxa_throw(this_00,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

void BaseAppender::AppendValueInternal(Vector &col, SRC input) {
	FlatVector::GetData<DST>(col)[chunk.size()] = Cast::Operation<SRC, DST>(input);
}